

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O1

drmModeAtomicReq * __thiscall QKmsDevice::threadLocalAtomicRequest(QKmsDevice *this)

{
  long *plVar1;
  undefined8 *puVar2;
  long lVar3;
  
  if (this->m_has_atomic_support == true) {
    puVar2 = (undefined8 *)QThreadStorageData::get();
    if (puVar2 == (undefined8 *)0x0) {
      puVar2 = (undefined8 *)operator_new(0x10);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)QThreadStorageData::set(&this->m_atomicReqs);
    }
    plVar1 = (long *)*puVar2;
    if (*plVar1 == 0) {
      lVar3 = drmModeAtomicAlloc();
      *plVar1 = lVar3;
    }
    return (drmModeAtomicReq *)*plVar1;
  }
  return (drmModeAtomicReq *)0x0;
}

Assistant:

drmModeAtomicReq *QKmsDevice::threadLocalAtomicRequest()
{
    if (!m_has_atomic_support)
        return nullptr;

    AtomicReqs &a(m_atomicReqs.localData());
    if (!a.request)
        a.request = drmModeAtomicAlloc();

    return a.request;
}